

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csg_parser.cpp
# Opt level: O0

token * ocmesh::details::lex(token *__return_storage_ptr__,istream *stream)

{
  int iVar1;
  kind_t kind;
  ulong uVar2;
  bool bVar3;
  string local_1c0;
  string local_1a0;
  undefined1 local_180 [8];
  string id;
  float value;
  allocator<char> local_131;
  string local_130;
  allocator<char> local_109;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_69;
  string local_68;
  char local_45;
  char c;
  string local_38;
  istream *local_18;
  istream *stream_local;
  
  local_18 = stream;
  stream_local = (istream *)__return_storage_ptr__;
  skipwhile<int(*)(int)noexcept>(stream,isspace);
  skipcomments(local_18);
  uVar2 = std::ios::eof();
  if ((uVar2 & 1) == 0) {
    local_45 = std::istream::peek();
    if (local_45 == '(') {
      std::istream::get();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"(",&local_69);
      token::token(__return_storage_ptr__,lparen,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      std::allocator<char>::~allocator(&local_69);
    }
    else if (local_45 == ')') {
      std::istream::get();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,")",&local_91);
      token::token(__return_storage_ptr__,rparen,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::allocator<char>::~allocator(&local_91);
    }
    else if (local_45 == ',') {
      std::istream::get();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,",",&local_131);
      token::token(__return_storage_ptr__,comma,&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      std::allocator<char>::~allocator(&local_131);
    }
    else if (local_45 == ';') {
      std::istream::get();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,";",&local_109);
      token::token(__return_storage_ptr__,semicolon,&local_108);
      std::__cxx11::string::~string((string *)&local_108);
      std::allocator<char>::~allocator(&local_109);
    }
    else if (local_45 == '=') {
      std::istream::get();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&value,"=",(allocator<char> *)(id.field_2._M_local_buf + 0xf));
      token::token(__return_storage_ptr__,equals,(string *)&value);
      std::__cxx11::string::~string((string *)&value);
      std::allocator<char>::~allocator((allocator<char> *)(id.field_2._M_local_buf + 0xf));
    }
    else if (local_45 == '{') {
      std::istream::get();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"{",&local_b9);
      token::token(__return_storage_ptr__,lbrace,&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::allocator<char>::~allocator(&local_b9);
    }
    else if (local_45 == '}') {
      std::istream::get();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"}",&local_e1);
      token::token(__return_storage_ptr__,rbrace,&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::allocator<char>::~allocator(&local_e1);
    }
    else {
      if ((local_45 != '-') && (iVar1 = isdigit((int)local_45), iVar1 == 0)) {
        if ((local_45 != '_') && (iVar1 = isalpha((int)local_45), iVar1 == 0)) {
          std::__cxx11::string::string((string *)&local_1c0);
          token::token(__return_storage_ptr__,unknown,&local_1c0);
          std::__cxx11::string::~string((string *)&local_1c0);
          return __return_storage_ptr__;
        }
        std::__cxx11::string::string((string *)local_180);
        while( true ) {
          bVar3 = true;
          if (local_45 != '_') {
            iVar1 = isalnum((int)local_45);
            bVar3 = iVar1 != 0;
          }
          if (!bVar3) break;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180,
                     local_45);
          std::istream::get();
          local_45 = std::istream::peek();
        }
        kind = find_keyword((string *)local_180);
        std::__cxx11::string::string
                  ((string *)&local_1a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180);
        token::token(__return_storage_ptr__,kind,&local_1a0);
        std::__cxx11::string::~string((string *)&local_1a0);
        std::__cxx11::string::~string((string *)local_180);
        return __return_storage_ptr__;
      }
      std::istream::operator>>((istream *)local_18,(float *)((long)&id.field_2 + 8));
      token::token(__return_storage_ptr__,(float)id.field_2._8_4_);
    }
  }
  else {
    std::__cxx11::string::string((string *)&local_38);
    token::token(__return_storage_ptr__,eof,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

token lex(std::istream &stream)
    {
        skipwhile(stream, isspace);
        
        skipcomments(stream);
        
        if(stream.eof())
            return token::eof;
        
        // Peek at next character
        char c = stream.peek();
        
        // Lex punctuation
        switch (c) {
            case '(':
                stream.get();
                return token(token::lparen, "(");
            case ')':
                stream.get();
                return token(token::rparen, ")");
            case '{':
                stream.get();
                return token(token::lbrace, "{");
            case '}':
                stream.get();
                return token(token::rbrace, "}");
            case ';':
                stream.get();
                return token(token::semicolon, ";");
            case ',':
                stream.get();
                return token(token::comma, ",");
            case '=':
                stream.get();
                return token(token::equals, "=");
        }
        
        // Lex numbers
        if(c == '-' || std::isdigit(c)) {
            float value;
            stream >> value;
            return token(value);
        }
        
        // Lex identifiers
        if(c == '_' || std::isalpha(c)) {
            std::string id;
            while (c == '_' || std::isalnum(c)) {
                id.push_back(c);
                stream.get();
                c = stream.peek();
            }
            
            return token(find_keyword(id), id);
        }
        
        return token::unknown;
    }